

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O3

void __thiscall
covenant::DFA<covenant::Sym>::transition(DFA<covenant::Sym> *this,State s,Sym *val,State r)

{
  pointer *ppaVar1;
  vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
  *this_00;
  iterator __position;
  ulong uVar2;
  pointer pvVar3;
  ulong uVar4;
  vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
  local_58;
  Sym *local_38;
  
  uVar2 = (ulong)s.id;
  pvVar3 = (this->trans).
           super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->trans).
                 super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
          -0x5555555555555555;
  local_38 = val;
  if (uVar4 < uVar2 || uVar4 - uVar2 == 0) {
    do {
      local_58.
      super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.
      super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.
      super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<covenant::DFA<covenant::Sym>::Edge,std::allocator<covenant::DFA<covenant::Sym>::Edge>>,std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,std::allocator<covenant::DFA<covenant::Sym>::Edge>>>>
      ::
      emplace_back<std::vector<covenant::DFA<covenant::Sym>::Edge,std::allocator<covenant::DFA<covenant::Sym>::Edge>>>
                ((vector<std::vector<covenant::DFA<covenant::Sym>::Edge,std::allocator<covenant::DFA<covenant::Sym>::Edge>>,std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,std::allocator<covenant::DFA<covenant::Sym>::Edge>>>>
                  *)&this->trans,&local_58);
      if ((anon_struct_8_2_19f0db9c)
          local_58.
          super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
          ._M_impl.super__Vector_impl_data._M_start != (anon_struct_8_2_19f0db9c)0x0) {
        operator_delete(local_58.
                        super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      pvVar3 = (this->trans).
               super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->trans).
                     super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
              -0x5555555555555555;
    } while (uVar4 < uVar2 || uVar4 - uVar2 == 0);
  }
  this_00 = pvVar3 + uVar2;
  local_58.
  super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = r.id;
  local_58.
  super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = local_38->x;
  __position._M_current =
       (this_00->
       super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this_00->
      super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
    ::_M_realloc_insert<covenant::DFA<covenant::Sym>::Edge>
              (this_00,__position,(anon_struct_8_2_19f0db9c *)&local_58);
  }
  else {
    *__position._M_current =
         (anon_struct_8_2_19f0db9c)
         local_58.
         super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ppaVar1 = &(this_00->
               super__Vector_base<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  return;
}

Assistant:

void transition(State s, const V& val, State r) 
    {
      while( s.id >= trans.size() )
        trans.push_back( vector<Edge>() );
      
      trans[s.id].push_back( mk_edge(val, r.id) );
    }